

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_server.cpp
# Opt level: O2

void ReadRequestHandler(CManager cm,CMConnection conn,void *vevent,void *client_data,attr_list attrs
                       )

{
  mapped_type pAVar1;
  uint64_t size;
  mapped_type *ppAVar2;
  void *__ptr;
  ssize_t sVar3;
  ostream *poVar4;
  void *__buf;
  size_t __size;
  ulong local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  uint64_t local_60;
  void *local_58;
  string local_50;
  
  local_78 = *(ulong *)((long)vevent + 8);
  ppAVar2 = std::__detail::
            _Map_base<unsigned_long,_std::pair<const_unsigned_long,_AnonSimpleFile_*>,_std::allocator<std::pair<const_unsigned_long,_AnonSimpleFile_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_AnonSimpleFile_*>,_std::allocator<std::pair<const_unsigned_long,_AnonSimpleFile_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&SimpleFileMap,&local_78);
  pAVar1 = *ppAVar2;
  last_service_time.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  if (pAVar1->m_CurrentOffset != *(size_t *)((long)vevent + 0x10)) {
    lseek(pAVar1->m_FileDescriptor,*(size_t *)((long)vevent + 0x10),0);
    pAVar1->m_CurrentOffset = *(size_t *)((long)vevent + 0x10);
  }
  __size = *(size_t *)((long)vevent + 0x18);
  __ptr = malloc(__size);
  __buf = __ptr;
  do {
    if (__size == 0) {
      size = *(uint64_t *)((long)vevent + 0x18);
      pAVar1->m_CurrentOffset = pAVar1->m_CurrentOffset + size;
      local_78 = (ulong)*vevent;
      uStack_70 = *(undefined8 *)((long)vevent + 0x20);
      local_68 = 0x7f;
      local_60 = size;
      local_58 = __ptr;
      if (1 < verbose) {
        poVar4 = std::operator<<((ostream *)&std::cout,"Returning ");
        readable_size_abi_cxx11_(&local_50,size);
        poVar4 = std::operator<<(poVar4,(string *)&local_50);
        poVar4 = std::operator<<(poVar4," for Read ");
        std::endl<char,std::char_traits<char>>(poVar4);
        std::__cxx11::string::~string((string *)&local_50);
      }
      pAVar1->m_BytesSent = size + pAVar1->m_BytesSent;
      pAVar1->m_OperationCount = pAVar1->m_OperationCount + 1;
      TotalSimpleBytesSent = TotalSimpleBytesSent + size;
      TotalSimpleReads = TotalSimpleReads + 1;
      CMwrite(conn,*(undefined8 *)((long)client_data + 0x38),&local_78);
LAB_00110a43:
      free(__ptr);
      return;
    }
    sVar3 = read(pAVar1->m_FileDescriptor,__buf,(long)(int)__size);
    if (sVar3 < 1) {
      poVar4 = std::operator<<((ostream *)&std::cout,"Read failed! BAD!");
      std::endl<char,std::char_traits<char>>(poVar4);
      goto LAB_00110a43;
    }
    __size = __size - sVar3;
    __buf = (void *)((long)__buf + sVar3);
  } while( true );
}

Assistant:

static void ReadRequestHandler(CManager cm, CMConnection conn, void *vevent, void *client_data,
                               attr_list attrs)
{
    ReadRequestMsg ReadMsg = static_cast<ReadRequestMsg>(vevent);
    AnonSimpleFile *f = SimpleFileMap[ReadMsg->FileHandle];
    struct Remote_evpath_state *ev_state = static_cast<struct Remote_evpath_state *>(client_data);
    last_service_time = std::chrono::steady_clock::now();
    if (f->m_CurrentOffset != ReadMsg->Offset)
    {
        lseek(f->m_FileDescriptor, (long)ReadMsg->Offset, SEEK_SET);
        f->m_CurrentOffset = ReadMsg->Offset;
    }
    char *tmp = (char *)malloc(ReadMsg->Size);
    size_t remaining = ReadMsg->Size;
    char *pointer = tmp;
    while (remaining > 0)
    {
        ssize_t ret = read(f->m_FileDescriptor, pointer, (int)remaining);
        if (ret <= 0)
        {
            // EOF or error,  should send a message back, but we haven't define error handling yet
            std::cout << "Read failed! BAD!" << std::endl;
            // instead free tmp and return;
            free(tmp);
            return;
        }
        else
        {
            remaining -= ret;
            pointer += ret;
        }
    }
    f->m_CurrentOffset += ReadMsg->Size;
    _ReadResponseMsg Response;
    memset(&Response, 0, sizeof(Response));
    Response.Size = ReadMsg->Size;
    Response.ReadData = (char *)tmp;
    Response.ReadResponseCondition = ReadMsg->ReadResponseCondition;
    Response.Dest = ReadMsg->Dest;
    Response.OperatorType = Operator::OperatorType::COMPRESS_NULL;
    if (verbose >= 2)
        std::cout << "Returning " << readable_size(Response.Size) << " for Read " << std::endl;
    f->m_BytesSent += Response.Size;
    f->m_OperationCount++;
    TotalSimpleBytesSent += Response.Size;
    TotalSimpleReads++;
    CMwrite(conn, ev_state->ReadResponseFormat, &Response);
    free(tmp);
}